

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_stream.cpp
# Opt level: O0

int __thiscall mpt::io::stream::set_property(stream *this,char *pr,convertable *src)

{
  convertable *pcVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte local_2d;
  int ret_1;
  uint8_t l;
  convertable *pcStack_28;
  int ret;
  convertable *src_local;
  char *pr_local;
  stream *this_local;
  
  pcStack_28 = src;
  src_local = (convertable *)pr;
  pr_local = (char *)this;
  if (pr == (char *)0x0) {
    if (this->_srm == (stream *)0x0) {
      this_local._4_4_ = -4;
    }
    else {
      ret_1 = mpt_stream_setter(this->_srm,src);
      if (-1 < ret_1) {
        reference<mpt::metatype>::set_instance(&this->_ctx,(metatype *)0x0);
      }
      this_local._4_4_ = ret_1;
    }
  }
  else {
    iVar3 = strcasecmp(pr,"idlen");
    pcVar1 = pcStack_28;
    if (iVar3 == 0) {
      this_local._4_4_ = -1;
    }
    else if (this->_inputFile < 0) {
      if (pcStack_28 == (convertable *)0x0) {
        local_2d = 0;
      }
      else {
        iVar3 = type_properties<unsigned_char>::id(true);
        iVar3 = (**pcVar1->_vptr_convertable)(pcVar1,(long)iVar3,&local_2d);
        if (iVar3 < 0) {
          return iVar3;
        }
        uVar4 = (uint)local_2d;
        bVar2 = std::numeric_limits<unsigned_char>::max();
        if (bVar2 / 2 + 1 < uVar4) {
          return -2;
        }
      }
      this->_idlen = local_2d;
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = -4;
    }
  }
  return this_local._4_4_;
}

Assistant:

int io::stream::set_property(const char *pr, convertable *src)
{
	if (!pr) {
		if (!_srm) {
			return BadOperation;
		}
		int ret = mpt_stream_setter(_srm, src);
		if (ret >= 0) {
			_ctx.set_instance(0);
		}
		return ret;
	}
	if (strcasecmp(pr, "idlen")) {
		if (_inputFile >= 0) {
			return BadOperation;
		}
		uint8_t l;
		
		if (!src) {
			l = 0;
		} else {
			int ret = src->convert(type_properties<uint8_t>::id(true), &l);
			if (ret < 0) {
				return ret;
			}
			if (l > std::numeric_limits<__decltype(_idlen)>::max() / 2 + 1) {
				return BadValue;
			}
		}
		_idlen = l;
		return 0;
	}
	return BadArgument;
}